

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

Ptr<Image>
myvk::Image::CreateTexture2D
          (Ptr<Device> *device,VkExtent2D *size,uint32_t mip_level,VkFormat format,
          VkImageUsageFlags usage,
          vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
          *access_queue)

{
  undefined4 in_ECX;
  undefined8 *in_RDX;
  element_type *in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  Ptr<Image> PVar1;
  VkImageCreateInfo create_info;
  vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
  *in_stack_00000120;
  VmaMemoryUsage in_stack_00000128;
  VmaAllocationCreateFlags in_stack_0000012c;
  VkImageCreateInfo *in_stack_00000130;
  Ptr<Device> *in_stack_00000138;
  undefined4 local_80 [5];
  undefined4 local_6c;
  undefined4 local_68;
  undefined8 local_64;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_30;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 *local_18;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  memset(local_80,0,0x58);
  local_80[0] = 0xe;
  local_6c = 1;
  local_64 = *local_18;
  local_5c = 1;
  local_58 = local_1c;
  local_54 = 1;
  local_68 = local_20;
  local_4c = 0;
  local_30 = 0;
  local_48 = local_24;
  local_50 = 1;
  PVar1 = Create(in_stack_00000138,in_stack_00000130,in_stack_0000012c,in_stack_00000128,
                 in_stack_00000120);
  PVar1.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Ptr<Image>)PVar1.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Image> Image::CreateTexture2D(const Ptr<Device> &device, const VkExtent2D &size, uint32_t mip_level,
                                  VkFormat format, VkImageUsageFlags usage,
                                  const std::vector<Ptr<Queue>> &access_queue) {
	VkImageCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
	create_info.imageType = VK_IMAGE_TYPE_2D;
	create_info.extent = {size.width, size.height, 1};
	create_info.mipLevels = mip_level;
	create_info.arrayLayers = 1;
	create_info.format = format;
	create_info.tiling = VK_IMAGE_TILING_OPTIMAL;
	create_info.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
	create_info.usage = usage;
	create_info.samples = VK_SAMPLE_COUNT_1_BIT;

	return Create(device, create_info, 0, VMA_MEMORY_USAGE_AUTO_PREFER_DEVICE, access_queue);
}